

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextLineCommentDoc(Lexer *this)

{
  uint uVar1;
  Lexer *in_RSI;
  char cVar2;
  
  nextChar(in_RSI);
  cVar2 = (char)in_RSI + -0x40;
  if ((in_RSI->lastComment)._M_string_length != 0) {
    std::__cxx11::string::push_back(cVar2);
  }
  while ((uVar1 = in_RSI->currentChar + 1, 0xe < uVar1 || ((0x4801U >> (uVar1 & 0x1f) & 1) == 0))) {
    std::__cxx11::string::push_back(cVar2);
    nextChar(in_RSI);
  }
  nextToken(this);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextLineCommentDoc() noexcept {
  nextChar();
  if (!lastComment.empty())
    lastComment += '\n';

  while (currentChar != EOF && currentChar != '\n' && currentChar != '\r') {
    lastComment += (char) currentChar;
    nextChar();
  }

  return nextToken();
}